

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<const_char_*>::reserve(Array<const_char_*> *this,usize size)

{
  char **ppcVar1;
  char **ppcVar2;
  char **end;
  char **src;
  char **dest;
  char **newData;
  usize size_local;
  Array<const_char_*> *this_local;
  
  if ((this->_capacity < size) || (((this->_begin).item == (char **)0x0 && (size != 0)))) {
    if (this->_capacity < size) {
      this->_capacity = size;
    }
    this->_capacity = this->_capacity | 3;
    ppcVar2 = (char **)operator_new__(this->_capacity << 3);
    src = ppcVar2;
    if ((this->_begin).item != (char **)0x0) {
      ppcVar1 = (this->_end).item;
      for (end = (this->_begin).item; end != ppcVar1; end = end + 1) {
        *src = *end;
        src = src + 1;
      }
      ppcVar1 = (this->_begin).item;
      if (ppcVar1 != (char **)0x0) {
        operator_delete__(ppcVar1);
      }
    }
    (this->_begin).item = ppcVar2;
    (this->_end).item = src;
  }
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }